

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O0

void __thiscall
StrongConnectedComponents::buildAdjList
          (StrongConnectedComponents *this,vector<int,_std::allocator<int>_> *nodes,SCCResult *sccr)

{
  bool bVar1;
  int iVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  size_type sVar3;
  const_reference pvVar4;
  const_reference this_01;
  size_type sVar5;
  SCCResult *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  int succ;
  int j;
  int ns;
  value_type *adjList_node;
  vector<int,_std::allocator<int>_> *sccr_adjlist_node;
  int node;
  int i;
  size_type nodes_s;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *lowestIdAdjacencyList;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__x;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar7;
  undefined4 in_stack_ffffffffffffffbc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  
  this_00 = SCCResult::getAdjListForWrite(in_RDX);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x1b3035);
  __x = this_00;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)(in_RDI + 8));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (!bVar1) {
    for (local_2c = 0; (ulong)(long)local_2c < sVar3; local_2c = local_2c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_2c);
      iVar2 = *pvVar4;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](this_00,(long)iVar2);
      this_01 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 8),(long)iVar2);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b30cf);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(this_01);
      iVar2 = (int)sVar5;
      for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar7);
        vVar6 = *pvVar4;
        bVar1 = find_vec<int>(this_01,(int *)CONCAT44(iVar2,iVar7));
        if (bVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(vVar6,in_stack_ffffffffffffffb0),
                     (value_type_conflict3 *)__x);
        }
      }
    }
  }
  return;
}

Assistant:

void StrongConnectedComponents::buildAdjList(const std::vector<int>& nodes, SCCResult& sccr) const {
    std::vector<std::vector<int>>& lowestIdAdjacencyList = sccr.getAdjListForWrite();
    auto nodes_s = nodes.size();
    lowestIdAdjacencyList.clear();
    lowestIdAdjacencyList.resize(adjList.size());
    if (!nodes.empty()) {
        for (int i = 0; i < nodes_s; i++) {
            int node = nodes[i];
            std::vector<int>& sccr_adjlist_node = lowestIdAdjacencyList[node];
            auto& adjList_node = adjList[node];
            sccr_adjlist_node.clear();
            const int ns = adjList_node.size();
            for (int j = 0; j < ns; j++) {
                int succ = adjList_node[j];
                if (find_vec(nodes, succ)) {
                    sccr_adjlist_node.push_back(succ);
                }
            }
        }
    }
}